

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall
CppGenerator::createRelationSortingOrder(CppGenerator *this,TDNode *node,size_t *parent_id)

{
  reference pvVar1;
  element_type *this_00;
  TDNode *in_RDX;
  CppGenerator *in_RSI;
  long in_RDI;
  size_t var_1;
  var_bitset additionalVars;
  size_t var;
  size_t orderIdx;
  var_bitset interaction;
  size_t *neighID;
  TDNode *neighbor;
  size_t neigh;
  bitset<100UL> *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff56;
  byte in_stack_ffffffffffffff57;
  reference local_98;
  ulong local_88;
  _Base_bitset<2UL> local_80;
  _Base_bitset<2UL> local_70;
  reference local_60;
  ulong local_50;
  long local_48;
  _Base_bitset<2UL> local_40;
  size_t *local_30;
  TDNode *local_28;
  size_t *parent_id_00;
  
  for (parent_id_00 = (size_t *)0x0;
      parent_id_00 < (size_t *)(in_RSI->_outputDirectory)._M_string_length;
      parent_id_00 = (size_t *)((long)parent_id_00 + 1)) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &(in_RSI->_outputDirectory).field_2,(size_type)parent_id_00);
    if (*pvVar1 != *(value_type *)&in_RDX->_name) {
      this_00 = std::
                __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x28237d);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &(in_RSI->_outputDirectory).field_2,(size_type)parent_id_00);
      local_28 = TreeDecomposition::getRelation
                           ((TreeDecomposition *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                            (size_t)in_stack_ffffffffffffff48);
      local_30 = &local_28->_id;
      local_40._M_w =
           (_WordT  [2])std::operator&(in_stack_ffffffffffffff48,(bitset<100UL> *)0x2823e1);
      local_48 = 0;
      for (local_50 = 0; local_50 < 100; local_50 = local_50 + 1) {
        std::bitset<100UL>::operator[]
                  ((bitset<100UL> *)this_00,
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
        in_stack_ffffffffffffff57 =
             std::bitset::reference::operator_cast_to_bool
                       ((reference *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
        std::bitset<100UL>::reference::~reference(&local_60);
        if ((in_stack_ffffffffffffff57 & 1) != 0) {
          *(ulong *)(*(long *)(*(long *)(in_RDI + 0x108) + *local_30 * 8) + local_48 * 8) = local_50
          ;
          local_48 = local_48 + 1;
        }
      }
      local_80._M_w = (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)this_00);
      local_70._M_w =
           (_WordT  [2])std::operator&(in_stack_ffffffffffffff48,(bitset<100UL> *)0x2824bf);
      for (local_88 = 0; local_88 < 100; local_88 = local_88 + 1) {
        std::bitset<100UL>::operator[]
                  ((bitset<100UL> *)this_00,
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
        in_stack_ffffffffffffff56 =
             std::bitset::reference::operator_cast_to_bool
                       ((reference *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
        std::bitset<100UL>::reference::~reference(&local_98);
        if ((in_stack_ffffffffffffff56 & 1) != 0) {
          *(ulong *)(*(long *)(*(long *)(in_RDI + 0x108) + *local_30 * 8) + local_48 * 8) = local_88
          ;
          local_48 = local_48 + 1;
        }
      }
      createRelationSortingOrder(in_RSI,in_RDX,parent_id_00);
    }
  }
  return;
}

Assistant:

void CppGenerator::createRelationSortingOrder(TDNode* node, const size_t& parent_id)
{
    // get intersection with parent Node node
    for (size_t neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
    {
        if (node->_neighbors[neigh] != parent_id)
        {
            TDNode* neighbor = _td->getRelation(node->_neighbors[neigh]);
            const size_t& neighID = neighbor->_id;
            
            var_bitset interaction = node->_bag & neighbor->_bag;
            
            size_t orderIdx = 0;
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (interaction[var])
                {
                    // add to sort order
                    sortOrders[neighID][orderIdx] = var;
                    ++orderIdx;
                }
            }

            var_bitset additionalVars =  ~node->_bag & neighbor->_bag;
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (additionalVars[var])
                {
                    // add to sort order
                    sortOrders[neighID][orderIdx] = var;
                    ++orderIdx;
                }
            } 
            createRelationSortingOrder(neighbor, node->_id);
        }
    }
}